

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeDatabase(Parse *pParse,int iDb)

{
  int iStatCur_00;
  int iVar1;
  Schema *pSVar2;
  Table *pTab;
  int iMem;
  int iStatCur;
  HashElem *k;
  Schema *pSchema;
  sqlite3 *db;
  int iDb_local;
  Parse *pParse_local;
  
  pSVar2 = pParse->db->aDb[iDb].pSchema;
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur_00 = pParse->nTab;
  pParse->nTab = pParse->nTab + 3;
  openStatTable(pParse,iDb,iStatCur_00,(char *)0x0,(char *)0x0);
  iVar1 = pParse->nMem;
  for (_iMem = (pSVar2->tblHash).first; _iMem != (HashElem *)0x0; _iMem = _iMem->next) {
    analyzeOneTable(pParse,(Table *)_iMem->data,(Index *)0x0,iStatCur_00,iVar1 + 1);
  }
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeDatabase(Parse *pParse, int iDb){
  sqlite3 *db = pParse->db;
  Schema *pSchema = db->aDb[iDb].pSchema;    /* Schema of database iDb */
  HashElem *k;
  int iStatCur;
  int iMem;

  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  openStatTable(pParse, iDb, iStatCur, 0, 0);
  iMem = pParse->nMem+1;
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(k=sqliteHashFirst(&pSchema->tblHash); k; k=sqliteHashNext(k)){
    Table *pTab = (Table*)sqliteHashData(k);
    analyzeOneTable(pParse, pTab, 0, iStatCur, iMem);
  }
  loadAnalysis(pParse, iDb);
}